

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O3

bool tinyusdz::tydra::GetCollection(Prim *prim,Collection **dst)

{
  bool bVar1;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  if (dst == (Collection **)0x0) {
    bVar1 = false;
  }
  else {
    local_30._8_8_ = 0;
    local_18 = ::std::
               _Function_handler<bool_(const_tinyusdz::Collection_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc:2452:13)>
               ::_M_invoke;
    local_20 = ::std::
               _Function_handler<bool_(const_tinyusdz::Collection_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc:2452:13)>
               ::_M_manager;
    local_30._M_unused._M_object = dst;
    bVar1 = ApplyToCollection(prim,(function<bool_(const_tinyusdz::Collection_*)> *)&local_30);
    if (local_20 != (code *)0x0) {
      (*local_20)(&local_30,&local_30,__destroy_functor);
    }
  }
  return bVar1;
}

Assistant:

bool GetCollection(const Prim &prim, const Collection **dst) {
  if (!dst) {
    return false;
  }

  auto fn = [dst](const Collection *coll) {
    (*dst) = coll;
    return true;
  };

  bool ret = ApplyToCollection(prim, fn);

  return ret;
}